

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRConstant * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::
allocate<unsigned_int_const&,unsigned_int_const&,bool>
          (ObjectPool<diligent_spirv_cross::SPIRConstant> *this,uint *p,uint *p_1,bool *p_2)

{
  uint uVar1;
  SPIRConstant *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRConstant **ppSVar4;
  TypeID local_5c;
  SPIRConstant *local_58;
  SPIRConstant *ptr;
  uint local_44;
  SPIRConstant *pSStack_40;
  uint i;
  SPIRConstant *ptr_1;
  bool *pbStack_30;
  uint num_objects;
  bool *p_local_2;
  uint *p_local_1;
  uint *p_local;
  ObjectPool<diligent_spirv_cross::SPIRConstant> *this_local;
  
  pbStack_30 = p_2;
  p_local_2 = (bool *)p_1;
  p_local_1 = p;
  p_local = (uint *)this;
  bVar2 = VectorView<diligent_spirv_cross::SPIRConstant_*>::empty
                    (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_40 = (SPIRConstant *)malloc((ulong)ptr_1._4_4_ * 0x168);
    if (pSStack_40 == (SPIRConstant *)0x0) {
      return (SPIRConstant *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::reserve
              (&this->vacants,(ulong)ptr_1._4_4_);
    for (local_44 = 0; local_44 < ptr_1._4_4_; local_44 = local_44 + 1) {
      ptr = pSStack_40 + local_44;
      SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRConstant,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRConstant*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRConstant,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffc0);
  }
  ppSVar4 = VectorView<diligent_spirv_cross::SPIRConstant_*>::back
                      (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>);
  local_58 = *ppSVar4;
  SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_58;
  TypedID<(diligent_spirv_cross::Types)1>::TypedID(&local_5c,*p_local_1);
  SPIRConstant::SPIRConstant(this_00,local_5c,*(uint32_t *)p_local_2,(bool)(*pbStack_30 & 1));
  return local_58;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}